

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O1

basic_string_view<char,_std::char_traits<char>_> __thiscall
jsoncons::basic_staj_event<char>::get<std::basic_string_view<char,std::char_traits<char>>>
          (basic_staj_event<char> *this)

{
  size_t sVar1;
  ser_error *this_00;
  undefined8 extraout_RAX;
  char *pcVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  error_code ec_00;
  error_code ec;
  error_code local_20;
  
  local_20._M_value = 0;
  local_20._M_cat = (error_category *)std::_V2::system_category();
  if (this->event_type_ < byte_string_value) {
    pcVar2 = (char *)(this->value_).int64_value_;
    sVar1 = this->length_;
  }
  else {
    std::error_code::operator=(&local_20,not_string_view);
    pcVar2 = (char *)0x0;
    sVar1 = 0;
  }
  if (local_20._M_value == 0) {
    bVar3._M_str = pcVar2;
    bVar3._M_len = sVar1;
    return bVar3;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  ec_00._4_4_ = 0;
  ec_00._M_value = local_20._M_value;
  ec_00._M_cat = local_20._M_cat;
  ser_error::ser_error(this_00,ec_00);
  get<std::basic_string_view<char,std::char_traits<char>>>();
  __cxa_free_exception(this_00);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

T get() const
    {
        std::error_code ec;
        T val = get<T>(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec));
        }
        return val;
    }